

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.cpp
# Opt level: O0

void __thiscall OpenMD::NPTxyz::scaleSimBox(NPTxyz *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  long in_RDI;
  double dVar8;
  Mat3x3d hmat;
  Mat3x3d hmnew;
  Mat3x3d hm;
  RealType smallScale;
  RealType bigScale;
  RealType scaleFactor;
  Mat3x3d scaleMat;
  int j;
  int i;
  Snapshot *in_stack_fffffffffffffd68;
  SquareMatrix3<double> *in_stack_fffffffffffffd70;
  SquareMatrix3<double> *in_stack_fffffffffffffda0;
  double dVar9;
  SquareMatrix3<double> *in_stack_fffffffffffffda8;
  Mat3x3d *in_stack_fffffffffffffdf8;
  Snapshot *in_stack_fffffffffffffe00;
  double local_70;
  double local_68;
  RectMatrix<double,_3U,_3U> local_58;
  uint local_10;
  uint local_c;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x214d7c);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x214d89);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x214d98);
  local_68 = 1.0;
  local_70 = 1.0;
  for (local_c = 0; (int)local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; (int)local_10 < 3; local_10 = local_10 + 1) {
      pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_c,local_10);
      *pdVar7 = 0.0;
      if (local_c == local_10) {
        pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_c,local_10);
        *pdVar7 = 1.0;
      }
    }
  }
  for (local_c = 0; (int)local_c < 3; local_c = local_c + 1) {
    dVar8 = *(double *)(in_RDI + 8);
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_c);
    dVar8 = exp(dVar8 * *pdVar7);
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_c,local_c);
    *pdVar7 = dVar8;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_c,local_c);
    if (local_68 < *pdVar7) {
      pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_c,local_c);
      local_68 = *pdVar7;
    }
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_c,local_c);
    if (*pdVar7 < local_70) {
      pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,local_c,local_c);
      local_70 = *pdVar7;
    }
  }
  if ((1.1 < local_68) || (local_70 < 0.9)) {
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,0);
    dVar8 = *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,1);
    dVar1 = *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,2);
    dVar2 = *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,0);
    dVar3 = *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,1);
    dVar4 = *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,2);
    dVar9 = *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,2,0);
    dVar5 = *pdVar7;
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()(&local_58,2,1);
    dVar6 = *pdVar7;
    RectMatrix<double,_3U,_3U>::operator()(&local_58,2,2);
    snprintf(painCave.errMsg,2000,
             "NPTxyz error: Attempting a Box scaling of more than 10 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
             ,dVar8,dVar1,dVar2,dVar3,dVar4,dVar9,dVar5,dVar6);
    painCave.isFatal = 1;
    simError();
  }
  else {
    Snapshot::getHmat(in_stack_fffffffffffffd68);
    OpenMD::operator*(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    SquareMatrix3<double>::operator=
              (in_stack_fffffffffffffd70,(SquareMatrix3<double> *)in_stack_fffffffffffffd68);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x21532d);
    Snapshot::setHmat(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x215358);
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2153ad);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2153ba);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2153c7);
  return;
}

Assistant:

void NPTxyz::scaleSimBox() {
    int i, j;
    Mat3x3d scaleMat;
    RealType scaleFactor;
    RealType bigScale, smallScale;
    Mat3x3d hm;
    Mat3x3d hmnew;

    // Scale the box after all the positions have been moved:

    // Use a taylor expansion for eta products:  Hmat = Hmat . exp(dt * etaMat)
    //  Hmat = Hmat . ( Ident + dt * etaMat  + dt^2 * etaMat*etaMat / 2)

    bigScale   = 1.0;
    smallScale = 1.0;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        scaleMat(i, j) = 0.0;
        if (i == j) { scaleMat(i, j) = 1.0; }
      }
    }

    for (i = 0; i < 3; i++) {
      // calculate the scaleFactors

      scaleFactor = exp(dt * eta(i, i));

      scaleMat(i, i) = scaleFactor;

      if (scaleMat(i, i) > bigScale) { bigScale = scaleMat(i, i); }

      if (scaleMat(i, i) < smallScale) { smallScale = scaleMat(i, i); }
    }

    if ((bigScale > 1.1) || (smallScale < 0.9)) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "NPTxyz error: Attempting a Box scaling of more than 10 percent.\n"
          " Check your tauBarostat, as it is probably too small!\n\n"
          " scaleMat = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n",
          scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
          scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
          scaleMat(2, 2));
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat         = hmat * scaleMat;
      snap->setHmat(hmat);
    }
  }